

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaLoader.cpp
# Opt level: O1

void Assimp::insertMorphTimeValue
               (vector<Assimp::MorphTimeValues,_std::allocator<Assimp::MorphTimeValues>_> *values,
               float time,float weight,uint value)

{
  pointer *ppkVar1;
  pointer pMVar2;
  pointer pMVar3;
  iterator __position;
  key kVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  key k;
  MorphTimeValues val;
  key local_38;
  undefined1 local_30 [8];
  pointer local_28;
  pointer pkStack_20;
  pointer local_18;
  
  pMVar2 = (values->
           super__Vector_base<Assimp::MorphTimeValues,_std::allocator<Assimp::MorphTimeValues>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pMVar3 = (values->
           super__Vector_base<Assimp::MorphTimeValues,_std::allocator<Assimp::MorphTimeValues>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  local_38.mWeight = weight;
  local_38.mValue = value;
  local_30._0_4_ = time;
  if (((long)pMVar3 - (long)pMVar2 == 0) || (time < pMVar2->mTime)) {
    local_28 = (pointer)0x0;
    pkStack_20 = (pointer)0x0;
    local_18 = (pointer)0x0;
    std::vector<Assimp::MorphTimeValues::key,std::allocator<Assimp::MorphTimeValues::key>>::
    _M_realloc_insert<Assimp::MorphTimeValues::key_const&>
              ((vector<Assimp::MorphTimeValues::key,std::allocator<Assimp::MorphTimeValues::key>> *)
               &local_28,(iterator)0x0,&local_38);
    std::vector<Assimp::MorphTimeValues,_std::allocator<Assimp::MorphTimeValues>_>::insert
              (values,(values->
                      super__Vector_base<Assimp::MorphTimeValues,_std::allocator<Assimp::MorphTimeValues>_>
                      )._M_impl.super__Vector_impl_data._M_start,(value_type *)local_30);
  }
  else if (time < pMVar3[-1].mTime || time == pMVar3[-1].mTime) {
    if (pMVar3 == pMVar2) {
      return;
    }
    uVar5 = 1;
    uVar7 = 0;
    while( true ) {
      if (ABS(time - pMVar2[uVar7].mTime) < 1e-06) {
        __position._M_current =
             pMVar2[uVar7].mKeys.
             super__Vector_base<Assimp::MorphTimeValues::key,_std::allocator<Assimp::MorphTimeValues::key>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current !=
            pMVar2[uVar7].mKeys.
            super__Vector_base<Assimp::MorphTimeValues::key,_std::allocator<Assimp::MorphTimeValues::key>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          kVar4.mValue = value;
          kVar4.mWeight = weight;
          *__position._M_current = kVar4;
          ppkVar1 = &pMVar2[uVar7].mKeys.
                     super__Vector_base<Assimp::MorphTimeValues::key,_std::allocator<Assimp::MorphTimeValues::key>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppkVar1 = *ppkVar1 + 1;
          return;
        }
        std::vector<Assimp::MorphTimeValues::key,std::allocator<Assimp::MorphTimeValues::key>>::
        _M_realloc_insert<Assimp::MorphTimeValues::key_const&>
                  ((vector<Assimp::MorphTimeValues::key,std::allocator<Assimp::MorphTimeValues::key>>
                    *)&pMVar2[uVar7].mKeys,__position,&local_38);
        return;
      }
      uVar6 = (ulong)uVar5;
      if ((pMVar2[uVar7].mTime < time) && (time < pMVar2[uVar6].mTime)) break;
      uVar5 = uVar5 + 1;
      uVar7 = uVar6;
      if ((ulong)((long)pMVar3 - (long)pMVar2 >> 5) <= uVar6) {
        return;
      }
    }
    local_28 = (pointer)0x0;
    pkStack_20 = (pointer)0x0;
    local_18 = (pointer)0x0;
    std::vector<Assimp::MorphTimeValues::key,std::allocator<Assimp::MorphTimeValues::key>>::
    _M_realloc_insert<Assimp::MorphTimeValues::key_const&>
              ((vector<Assimp::MorphTimeValues::key,std::allocator<Assimp::MorphTimeValues::key>> *)
               &local_28,(iterator)0x0,&local_38);
    std::vector<Assimp::MorphTimeValues,_std::allocator<Assimp::MorphTimeValues>_>::insert
              (values,(values->
                      super__Vector_base<Assimp::MorphTimeValues,_std::allocator<Assimp::MorphTimeValues>_>
                      )._M_impl.super__Vector_impl_data._M_start + uVar7,(value_type *)local_30);
  }
  else {
    local_28 = (pointer)0x0;
    pkStack_20 = (pointer)0x0;
    local_18 = (pointer)0x0;
    std::vector<Assimp::MorphTimeValues::key,std::allocator<Assimp::MorphTimeValues::key>>::
    _M_realloc_insert<Assimp::MorphTimeValues::key_const&>
              ((vector<Assimp::MorphTimeValues::key,std::allocator<Assimp::MorphTimeValues::key>> *)
               &local_28,(iterator)0x0,&local_38);
    std::vector<Assimp::MorphTimeValues,_std::allocator<Assimp::MorphTimeValues>_>::insert
              (values,(values->
                      super__Vector_base<Assimp::MorphTimeValues,_std::allocator<Assimp::MorphTimeValues>_>
                      )._M_impl.super__Vector_impl_data._M_finish,(value_type *)local_30);
  }
  if (local_28 != (pointer)0x0) {
    operator_delete(local_28);
  }
  return;
}

Assistant:

void insertMorphTimeValue(std::vector<MorphTimeValues> &values, float time, float weight, unsigned int value)
{
    MorphTimeValues::key k;
    k.mValue = value;
    k.mWeight = weight;
    if (values.size() == 0 || time < values[0].mTime)
    {
        MorphTimeValues val;
        val.mTime = time;
        val.mKeys.push_back(k);
        values.insert(values.begin(), val);
        return;
    }
    if (time > values.back().mTime)
    {
        MorphTimeValues val;
        val.mTime = time;
        val.mKeys.push_back(k);
        values.insert(values.end(), val);
        return;
    }
    for (unsigned int i = 0; i < values.size(); i++)
    {
        if (std::abs(time - values[i].mTime) < 1e-6f)
        {
            values[i].mKeys.push_back(k);
            return;
        }
        else if (time > values[i].mTime && time < values[i + 1].mTime)
        {
            MorphTimeValues val;
            val.mTime = time;
            val.mKeys.push_back(k);
            values.insert(values.begin() + i, val);
            return;
        }
    }
    // should not get here
}